

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void rw::ps2::swizzleRaster(Raster *raster)

{
  int iVar1;
  uint8 *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  uint8 tmpbuf [4096];
  byte local_1038 [4104];
  
  uVar15 = raster->format;
  if ((uVar15 & 0x6000) != 0) {
    bVar12 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    if (((uVar15 >> 0xe & 1) == 0) && ((bVar12 & 2) != 0)) {
      uVar10 = 4;
      iVar14 = 0x10;
    }
    else {
      bVar16 = (uVar15 >> 0xe & 1) != 0;
      bVar17 = (bVar12 & 4) != 0;
      iVar14 = 0x20;
      if (!bVar17 || !bVar16) {
        iVar14 = 8;
      }
      bVar17 = bVar17 && bVar16;
      uVar10 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
    }
    iVar1 = raster->width;
    if (iVar14 < iVar1) {
      iVar14 = iVar1;
    }
    if ((int)uVar10 < raster->height) {
      uVar10 = raster->height;
    }
    bVar7 = 0;
    if (1 < iVar1) {
      bVar7 = 0;
      iVar9 = 1;
      do {
        bVar7 = bVar7 + 1;
        iVar9 = iVar9 * 2;
      } while (iVar9 < iVar1);
    }
    puVar2 = raster->pixels;
    uVar13 = (4 << (bVar7 & 0x1f)) - 1;
    if (((uVar15 >> 0xe & 1) == 0) || ((bVar12 & 4) == 0)) {
      if (((uVar15 >> 0xd & 1) != 0) && ((bVar12 & 2) != 0)) {
        uVar15 = 0;
        do {
          uVar3 = 0;
          do {
            uVar4 = uVar3 | uVar15;
            uVar5 = 0;
            do {
              local_1038
              [(((uint)(uVar5 >> 2) & 2 | (uVar3 & 2) >> 1) +
                ((uint)(uVar5 >> 1) & 0x3ffffff8 | (uint)uVar5 & 7 ^ (uVar4 * 2 ^ uVar15) & 4) * 4 |
               (uVar4 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar7 + 1 & 0x1f)) & uVar13] =
                   puVar2[(uVar4 << (bVar7 & 0x1f)) + (uint)uVar5];
              uVar5 = uVar5 + 1;
            } while (iVar14 + (uint)(iVar14 == 0) != uVar5);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 4);
          memcpy(puVar2 + (int)(uVar15 << (bVar7 & 0x1f)),local_1038,(ulong)(uint)(iVar14 * 4));
          uVar15 = uVar15 + 4;
        } while (uVar15 < uVar10);
      }
    }
    else {
      uVar15 = 0;
      do {
        uVar3 = 0;
        do {
          uVar6 = uVar3 | uVar15;
          uVar4 = 0;
          do {
            uVar11 = (uVar6 << (bVar7 & 0x1f)) + uVar4;
            uVar8 = (uVar4 >> 2 & 2 | (uVar3 & 2) >> 1) +
                    (uVar4 >> 1 & 0x3ffffff8 | uVar4 & 7 ^ (uVar6 * 2 ^ uVar15) & 4) * 4 |
                    (uVar6 >> 1 & 0x3ffffffe | uVar3 & 1) << (bVar7 + 1 & 0x1f);
            bVar12 = puVar2[uVar11 >> 1] >> 4;
            if ((uVar11 & 1) == 0) {
              bVar12 = puVar2[uVar11 >> 1] & 0xf;
            }
            uVar11 = (uVar8 & uVar13) >> 1;
            if ((uVar8 & 1) == 0) {
              bVar12 = local_1038[uVar11] & 0xf0 | bVar12;
            }
            else {
              bVar12 = bVar12 << 4 | local_1038[uVar11] & 0xf;
            }
            local_1038[uVar11] = bVar12;
            uVar4 = uVar4 + 1;
          } while (iVar14 + (uint)(iVar14 == 0) != uVar4);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 4);
        memcpy(puVar2 + (int)(uVar15 << (bVar7 - 1 & 0x1f)),local_1038,(ulong)(uint)(iVar14 * 2));
        uVar15 = uVar15 + 4;
      } while (uVar15 < uVar10);
    }
  }
  return;
}

Assistant:

void
swizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < raster->width; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = a & 1 ? px[a>>1] >> 4 : px[a>>1] & 0xF;
					tmpbuf[s>>1] = s & 1 ? (tmpbuf[s>>1]&0xF) | c<<4 : (tmpbuf[s>>1]&0xF0) | c;
				}
			memcpy(&px[y<<(logw-1)], tmpbuf, 2*w);
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					tmpbuf[s] = px[a];
				}
			memcpy(&px[y<<logw], tmpbuf, 4*w);
		}
	}
}